

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O2

Vector3 Vector3CubicHermite(Vector3 v1,Vector3 tangent1,Vector3 v2,Vector3 tangent2,float amount)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  Vector3 VVar6;
  
  fVar5 = amount * amount;
  fVar1 = fVar5 * amount;
  fVar4 = ((fVar1 + fVar1) - fVar5 * 3.0) + 1.0;
  fVar2 = fVar1 - fVar5;
  fVar3 = (fVar1 - (fVar5 + fVar5)) + amount;
  fVar1 = fVar5 * 3.0 - (fVar1 + fVar1);
  VVar6.x = v1.x * fVar4 + fVar3 * tangent1.x + fVar1 * v2.x + fVar2 * tangent2.x;
  VVar6.y = v1.y * fVar4 + fVar3 * tangent1.y + fVar1 * v2.y + fVar2 * tangent2.y;
  VVar6.z = v1.z * fVar4 + fVar3 * tangent1.z + fVar1 * v2.z + fVar2 * tangent2.z;
  return VVar6;
}

Assistant:

RMAPI Vector3 Vector3CubicHermite(Vector3 v1, Vector3 tangent1, Vector3 v2, Vector3 tangent2, float amount)
{
    Vector3 result = { 0 };

    float amountPow2 = amount*amount;
    float amountPow3 = amount*amount*amount;

    result.x = (2*amountPow3 - 3*amountPow2 + 1)*v1.x + (amountPow3 - 2*amountPow2 + amount)*tangent1.x + (-2*amountPow3 + 3*amountPow2)*v2.x + (amountPow3 - amountPow2)*tangent2.x;
    result.y = (2*amountPow3 - 3*amountPow2 + 1)*v1.y + (amountPow3 - 2*amountPow2 + amount)*tangent1.y + (-2*amountPow3 + 3*amountPow2)*v2.y + (amountPow3 - amountPow2)*tangent2.y;
    result.z = (2*amountPow3 - 3*amountPow2 + 1)*v1.z + (amountPow3 - 2*amountPow2 + amount)*tangent1.z + (-2*amountPow3 + 3*amountPow2)*v2.z + (amountPow3 - amountPow2)*tangent2.z;

    return result;
}